

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void pstore::command_line::
     apply_to_option<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,char_const(&)[6],pstore::command_line::details::positional_const&>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *opt,char (*m0) [6],positional *mods)

{
  name local_40;
  positional *local_20;
  positional *mods_local;
  char (*m0_local) [6];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *opt_local;
  
  local_20 = mods;
  mods_local = (positional *)m0;
  m0_local = (char (*) [6])opt;
  make_modifier(&local_40,*m0);
  name::
  apply<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>>
            (&local_40,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
              *)m0_local);
  name::~name(&local_40);
  apply_to_option<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,pstore::command_line::details::positional_const&>
            ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
              *)m0_local,local_20);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }